

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

void __thiscall Indexer::remove_dataset(Indexer *this,OnDiskDataset *dataset_ptr)

{
  bool bVar1;
  pointer pOVar2;
  pointer in_RSI;
  long in_RDI;
  iterator it;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *in_stack_ffffffffffffffd0;
  iterator in_stack_ffffffffffffffd8;
  __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
  local_18;
  pointer local_10;
  
  local_10 = in_RSI;
  local_18._M_current =
       (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
       std::
       vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::
    vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
    ::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
    ::operator*(&local_18);
    pOVar2 = std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::get
                       ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
                        in_stack_ffffffffffffffc0);
    if (pOVar2 == local_10) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
      ::operator*(&local_18);
      std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::operator->
                ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)0x170d42);
      OnDiskDataset::drop((OnDiskDataset *)this);
      in_stack_ffffffffffffffc0 =
           (__normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
            *)(in_RDI + 0xc0);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>const*,std::vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>>
      ::__normal_iterator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>*>
                (in_stack_ffffffffffffffc0,
                 (__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                  *)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffd8 =
           std::
           vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
           ::erase(in_stack_ffffffffffffffd0,(const_iterator)in_stack_ffffffffffffffd8._M_current);
      local_18._M_current =
           (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
           in_stack_ffffffffffffffd8;
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void Indexer::remove_dataset(const OnDiskDataset *dataset_ptr) {
    for (auto it = created_datasets.begin(); it != created_datasets.end();) {
        if ((*it).get() == dataset_ptr) {
            (*it)->drop();
            it = created_datasets.erase(it);
        } else {
            ++it;
        }
    }
}